

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvarlengtharray.h
# Opt level: O3

void __thiscall
QVLABase<QString>::reallocate_impl
          (QVLABase<QString> *this,qsizetype prealloc,void *array,qsizetype asize,qsizetype aalloc)

{
  void *__src;
  long lVar1;
  long lVar2;
  undefined1 auVar3 [16];
  size_t allocSize;
  size_t sVar4;
  void *__dest;
  qsizetype qVar5;
  
  __src = (this->super_QVLABaseBase).ptr;
  lVar1 = (this->super_QVLABaseBase).a;
  lVar2 = (this->super_QVLABaseBase).s;
  qVar5 = asize;
  if (lVar2 < asize) {
    qVar5 = lVar2;
  }
  __dest = __src;
  if (lVar1 != aalloc) {
    __dest = array;
    if (prealloc < aalloc) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = aalloc;
      allocSize = SUB168(auVar3 * ZEXT816(0x18),0);
      if (SUB168(auVar3 * ZEXT816(0x18),8) != 0) {
LAB_0041022f:
        qBadAlloc();
      }
      sVar4 = QtPrivate::expectedAllocSize(allocSize,0x10);
      prealloc = aalloc;
      if (sVar4 != 0) {
        prealloc = sVar4 / 0x18;
        allocSize = prealloc * 0x18;
      }
      if (allocSize == 0) goto LAB_0041022f;
      __dest = malloc(allocSize);
      if (__dest == (void *)0x0) goto LAB_0041022f;
    }
    if (qVar5 != 0) {
      memcpy(__dest,__src,qVar5 * 0x18);
    }
    (this->super_QVLABaseBase).ptr = __dest;
    (this->super_QVLABaseBase).a = prealloc;
  }
  (this->super_QVLABaseBase).s = qVar5;
  if (asize < lVar2) {
    std::_Destroy_aux<false>::__destroy<QString*>
              ((QString *)((long)__src + asize * 0x18),(QString *)((long)__src + lVar2 * 0x18));
    __dest = (this->super_QVLABaseBase).ptr;
  }
  if ((__src != array) && (__src != __dest)) {
    QtPrivate::sizedFree(__src,lVar1 * 0x18);
    return;
  }
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QVLABase<T>::reallocate_impl(qsizetype prealloc, void *array, qsizetype asize, qsizetype aalloc)
{
    Q_ASSERT(aalloc >= asize);
    Q_ASSERT(data());
    T *oldPtr = data();
    qsizetype osize = size();
    const qsizetype oalloc = capacity();

    const qsizetype copySize = qMin(asize, osize);
    Q_ASSERT(copySize >= 0);

    if (aalloc != oalloc) {
        QVLABaseBase::malloced_ptr guard;
        void *newPtr;
        qsizetype newA;
        if (aalloc > prealloc) {
            newPtr = QtPrivate::fittedMalloc(0, &aalloc, sizeof(T));
            guard.reset(newPtr);
            Q_CHECK_PTR(newPtr); // could throw
            // by design: in case of QT_NO_EXCEPTIONS malloc must not fail or it crashes here
            newA = aalloc;
        } else {
            newPtr = array;
            newA = prealloc;
        }
        QtPrivate::q_uninitialized_relocate_n(oldPtr, copySize,
                                              reinterpret_cast<T *>(newPtr));
        // commit:
        ptr = newPtr;
        guard.release();
        a = newA;
    }
    s = copySize;

    // destroy remaining old objects
    if constexpr (QTypeInfo<T>::isComplex) {
        if (osize > asize)
            std::destroy(oldPtr + asize, oldPtr + osize);
    }

    if (oldPtr != reinterpret_cast<T *>(array) && oldPtr != data())
        QtPrivate::sizedFree(oldPtr, oalloc, sizeof(T));
}